

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O2

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,void *buffer,size_t len)

{
  FourCC FVar1;
  uint32_t uVar2;
  impl *piVar3;
  undefined4 *puVar4;
  char *pcVar5;
  streampos sVar6;
  element_type *local_60;
  __shared_ptr<membuffer,_(__gnu_cxx::_Lock_policy)2> local_58;
  size_t len_local;
  __shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  __shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  len_local = len;
  if (buffer == (void *)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar4 = 0;
    pcVar5 = "Null buffer";
  }
  else {
    piVar3 = (impl *)operator_new(0x48);
    (piVar3->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (piVar3->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (piVar3->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (piVar3->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (piVar3->m_pos)._M_off = 0;
    (piVar3->m_pos)._M_state.__count = 0;
    (piVar3->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    piVar3->m_id = (_Type)0x0;
    piVar3->m_size = 0;
    (piVar3->m_limit)._M_off = 0;
    (piVar3->m_limit)._M_state.__count = 0;
    (piVar3->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    this->pimpl = piVar3;
    local_60 = (element_type *)buffer;
    std::make_shared<membuffer,char*,unsigned_long&>((char **)&local_58,(unsigned_long *)&local_60);
    std::__shared_ptr<std::streambuf,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<std::streambuf,(__gnu_cxx::_Lock_policy)2> *)&this->pimpl->m_buf,
               &local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    local_60 = (this->pimpl->m_buf).
               super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    std::make_shared<std::istream,std::streambuf*>
              ((basic_streambuf<char,_std::char_traits<char>_> **)&local_58);
    std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::operator=((__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)this->pimpl,
                (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    sVar6 = (streampos)std::istream::tellg();
    this->pimpl->m_pos = sVar6;
    std::istream::seekg((long)(this->pimpl->m_stream).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
    sVar6 = (streampos)std::istream::tellg();
    this->pimpl->m_limit = sVar6;
    std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_30,
                   (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)this->pimpl);
    FVar1 = read_id((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)&local_30,
                    this->pimpl->m_pos);
    *&(this->pimpl->m_id)._M_elems = FVar1._M_elems;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_40,
                   (__shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)this->pimpl);
    uVar2 = read_size((shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_> *)&local_40,
                      this->pimpl->m_pos);
    this->pimpl->m_size = uVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    piVar3 = this->pimpl;
    if ((long)((ulong)piVar3->m_size + (piVar3->m_pos)._M_off) <= (piVar3->m_limit)._M_off) {
      return;
    }
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar4 = 2;
    pcVar5 = "Chunk size outside of range";
  }
  *(char **)(puVar4 + 2) = pcVar5;
  __cxa_throw(puVar4,&Error::typeinfo,0);
}

Assistant:

riffcpp::Chunk::Chunk(const void *buffer, std::size_t len) {
  if (buffer == nullptr) {
    throw Error("Null buffer", ErrorType::NullBuffer);
  }

  pimpl = new riffcpp::Chunk::impl();

  const char *charbuf = static_cast<const char *>(buffer);

  pimpl->m_buf = std::make_shared<membuffer>(const_cast<char *>(charbuf), len);
  pimpl->m_stream = std::make_shared<std::istream>(pimpl->m_buf.get());
  pimpl->m_pos = pimpl->m_stream->tellg();
  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(pimpl->m_stream, pimpl->m_pos);
  pimpl->m_size = read_size(pimpl->m_stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}